

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

size_t __thiscall mocker::ir::Interpreter::executeInst(Interpreter *this,size_t idx)

{
  FuncModule *pFVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  long lVar4;
  shared_ptr<mocker::ir::Addr> *psVar5;
  element_type *peVar6;
  mapped_type mVar7;
  int64_t iVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t iVar11;
  long *plVar12;
  int64_t *piVar13;
  void *pvVar14;
  size_t sz;
  mapped_type *pmVar15;
  _Elt_pointer pAVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  shared_ptr<mocker::ir::Addr> *argReg;
  shared_ptr<mocker::ir::Addr> *reg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  bool bVar19;
  vector<long,_std::allocator<long>_> args;
  shared_ptr<mocker::ir::Phi> phi;
  vector<long,_std::allocator<long>_> local_78;
  mapped_type local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr<mocker::ir::Addr> local_48;
  _Elt_pointer local_38;
  
  pAVar16 = (this->ars).c.
            super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar16 ==
      (this->ars).c.
      super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pAVar16 = (this->ars).c.
              super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  pFVar1 = pAVar16[-1].curFunc._M_data;
  psVar2 = (pFVar1->insts).
           super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pFVar1->insts).
                    super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= idx) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",idx);
switchD_001096d5_default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                  ,0x200,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
  }
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &psVar2[idx].super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
  this_00._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar2 + idx) + 8);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
    }
  }
  p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar19 = p_Var3->_M_use_count == 3;
  _Var18._M_pi = p_Var17;
  if (bVar19) {
    p_Var17 = p_Var3;
    _Var18._M_pi = this_00._M_pi;
  }
  if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      UNLOCK();
      p_Var17 = p_Var3;
      _Var18._M_pi = this_00._M_pi;
    }
    else {
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      p_Var17 = p_Var3;
      _Var18._M_pi = this_00._M_pi;
    }
  }
  local_58 = idx;
  local_38 = pAVar16;
  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)&p_Var17[2]._M_use_count);
    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)&p_Var17[1]._M_use_count;
    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,iVar8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    idx = idx + 1;
  }
  if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
  }
  if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar19 = p_Var3->_M_use_count == 4;
    _Var18._M_pi = p_Var17;
    if (bVar19) {
      p_Var17 = p_Var3;
      _Var18._M_pi = this_00._M_pi;
    }
    if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        UNLOCK();
        p_Var17 = p_Var3;
        _Var18._M_pi = this_00._M_pi;
      }
      else {
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        p_Var17 = p_Var3;
        _Var18._M_pi = this_00._M_pi;
      }
    }
    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      uVar9 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(p_Var17 + 3));
      mVar7 = local_58;
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)&p_Var17[1]._M_use_count;
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      uVar10 = ~uVar9;
      if (p_Var17[2]._M_use_count == 0) {
        uVar10 = -uVar9;
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,uVar10);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      idx = mVar7 + 1;
    }
    if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
    }
    if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar19 = p_Var3->_M_use_count == 5;
      p_Var17 = _Var18._M_pi;
      if (bVar19) {
        _Var18._M_pi = this_00._M_pi;
        p_Var17 = p_Var3;
      }
      if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          UNLOCK();
          p_Var17 = p_Var3;
          _Var18._M_pi = this_00._M_pi;
        }
        else {
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          p_Var17 = p_Var3;
          _Var18._M_pi = this_00._M_pi;
        }
      }
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        uVar9 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(p_Var17 + 3));
        uVar10 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(p_Var17 + 4));
        switch(p_Var17[2]._M_use_count) {
        case 0:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,uVar10 | uVar9);
          break;
        case 1:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,uVar10 & uVar9);
          break;
        case 2:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,uVar10 ^ uVar9);
          break;
        case 3:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,
                         uVar9 << ((byte)uVar10 & 0x3f));
          break;
        case 4:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,
                         (long)uVar9 >> ((byte)uVar10 & 0x3f));
          break;
        case 5:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,uVar10 + uVar9);
          break;
        case 6:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,uVar9 - uVar10);
          break;
        case 7:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,uVar10 * uVar9);
          break;
        case 8:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,(long)uVar9 / (long)uVar10);
          break;
        case 9:
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,(long)uVar9 % (long)uVar10);
          break;
        default:
          goto switchD_001096d5_default;
        }
        mVar7 = local_58;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        }
        idx = mVar7 + 1;
      }
      if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
      }
      if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar19 = p_Var3->_M_use_count == 6;
        p_Var17 = _Var18._M_pi;
        if (bVar19) {
          _Var18._M_pi = this_00._M_pi;
          p_Var17 = p_Var3;
        }
        if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            UNLOCK();
            p_Var17 = p_Var3;
            _Var18._M_pi = this_00._M_pi;
          }
          else {
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            p_Var17 = p_Var3;
            _Var18._M_pi = this_00._M_pi;
          }
        }
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(p_Var17 + 3));
          iVar11 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(p_Var17 + 4));
          mVar7 = local_58;
          switch(p_Var17[2]._M_use_count) {
          case 0:
            bVar19 = iVar8 == iVar11;
            break;
          case 1:
            bVar19 = iVar8 != iVar11;
            break;
          case 2:
            bVar19 = iVar8 < iVar11;
            break;
          case 3:
            bVar19 = iVar11 < iVar8;
            break;
          case 4:
            bVar19 = iVar8 <= iVar11;
            break;
          case 5:
            bVar19 = iVar11 <= iVar8;
            break;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                          ,0x21b,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
          }
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)&p_Var17[1]._M_use_count;
          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish)->_M_use_count + 1;
            }
          }
          writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,(ulong)bVar19);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
          }
          idx = mVar7 + 1;
        }
        if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
        }
        if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          bVar19 = p_Var3->_M_use_count == 8;
          p_Var17 = _Var18._M_pi;
          if (bVar19) {
            _Var18._M_pi = this_00._M_pi;
            p_Var17 = p_Var3;
          }
          if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
              p_Var17 = p_Var3;
              _Var18._M_pi = this_00._M_pi;
            }
            else {
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              p_Var17 = p_Var3;
              _Var18._M_pi = this_00._M_pi;
            }
          }
          if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            plVar12 = (long *)readVal(this,(shared_ptr<mocker::ir::Addr> *)&p_Var17[2]._M_use_count)
            ;
            mVar7 = local_58;
            lVar4 = *plVar12;
            local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start = *(pointer *)&p_Var17[1]._M_use_count;
            local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish)->_M_use_count + 1;
              }
            }
            writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,lVar4);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            }
            idx = mVar7 + 1;
          }
          if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
          }
          if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar19 = p_Var3->_M_use_count == 7;
            p_Var17 = _Var18._M_pi;
            if (bVar19) {
              _Var18._M_pi = this_00._M_pi;
              p_Var17 = p_Var3;
            }
            if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                UNLOCK();
                p_Var17 = p_Var3;
                _Var18._M_pi = this_00._M_pi;
              }
              else {
                (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                p_Var17 = p_Var3;
                _Var18._M_pi = this_00._M_pi;
              }
            }
            if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(p_Var17 + 2));
              piVar13 = (int64_t *)readVal(this,(shared_ptr<mocker::ir::Addr> *)(p_Var17 + 1));
              *piVar13 = iVar8;
              idx = local_58 + 1;
            }
            if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
            }
            if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              bVar19 = p_Var3->_M_use_count == 9;
              p_Var17 = _Var18._M_pi;
              if (bVar19) {
                _Var18._M_pi = this_00._M_pi;
                p_Var17 = p_Var3;
              }
              if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                  UNLOCK();
                  p_Var17 = p_Var3;
                  _Var18._M_pi = this_00._M_pi;
                }
                else {
                  (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                  p_Var17 = p_Var3;
                  _Var18._M_pi = this_00._M_pi;
                }
              }
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pvVar14 = fastMalloc(this,8);
                mVar7 = local_58;
                local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start = *(pointer *)&p_Var17[1]._M_use_count;
                local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish)->_M_use_count + 1;
                  }
                }
                writeReg<void*>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,pvVar14);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish);
                }
                idx = mVar7 + 1;
              }
              if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
              }
              if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                bVar19 = p_Var3->_M_use_count == 10;
                p_Var17 = _Var18._M_pi;
                if (bVar19) {
                  _Var18._M_pi = this_00._M_pi;
                  p_Var17 = p_Var3;
                }
                if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                    UNLOCK();
                    p_Var17 = p_Var3;
                    _Var18._M_pi = this_00._M_pi;
                  }
                  else {
                    (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                    p_Var17 = p_Var3;
                    _Var18._M_pi = this_00._M_pi;
                  }
                }
                if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  sz = readVal(this,(shared_ptr<mocker::ir::Addr> *)&p_Var17[2]._M_use_count);
                  pvVar14 = fastMalloc(this,sz);
                  mVar7 = local_58;
                  local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start = *(pointer *)&p_Var17[1]._M_use_count;
                  local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)p_Var17[2]._vptr__Sp_counted_base;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish)->_M_use_count =
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish)->_M_use_count =
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish)->_M_use_count + 1;
                    }
                  }
                  writeReg<void*>(this,(shared_ptr<mocker::ir::Addr> *)&local_78,pvVar14);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_finish);
                  }
                  idx = mVar7 + 1;
                }
                if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
                }
                if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  bVar19 = p_Var3->_M_use_count == 0xb;
                  p_Var17 = _Var18._M_pi;
                  if (bVar19) {
                    _Var18._M_pi = this_00._M_pi;
                    p_Var17 = p_Var3;
                  }
                  if (bVar19 && this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                     ) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                      UNLOCK();
                      p_Var17 = p_Var3;
                      _Var18._M_pi = this_00._M_pi;
                    }
                    else {
                      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                      p_Var17 = p_Var3;
                      _Var18._M_pi = this_00._M_pi;
                    }
                  }
                  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    iVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)&p_Var17[1]._M_use_count);
                    lVar4 = *(long *)&p_Var17[(ulong)(iVar8 == 0) + 2]._M_use_count;
                    local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               p_Var17[(ulong)(iVar8 == 0) + 3]._vptr__Sp_counted_base;
                    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        local_50->_M_use_count = local_50->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        local_50->_M_use_count = local_50->_M_use_count + 1;
                      }
                    }
                    pFVar1 = local_38[-1].curFunc._M_data;
                    local_38[-1].lastBB = local_38[-1].curBB;
                    local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start = *(pointer *)(lVar4 + 8);
                    local_38[-1].curBB =
                         (size_t)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                    pmVar15 = std::__detail::
                              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&pFVar1->label2idx,(key_type *)&local_78);
                    idx = *pmVar15;
                    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
                    }
                  }
                  if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
                  }
                  if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    bVar19 = p_Var3->_M_use_count == 0xc;
                    p_Var17 = _Var18._M_pi;
                    if (bVar19) {
                      _Var18._M_pi = this_00._M_pi;
                      p_Var17 = p_Var3;
                    }
                    if (bVar19 && this_00._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                        UNLOCK();
                        p_Var17 = p_Var3;
                        _Var18._M_pi = this_00._M_pi;
                      }
                      else {
                        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                        p_Var17 = p_Var3;
                        _Var18._M_pi = this_00._M_pi;
                      }
                    }
                    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      pFVar1 = local_38[-1].curFunc._M_data;
                      local_38[-1].lastBB = local_38[-1].curBB;
                      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           *(pointer *)(*(long *)&p_Var17[1]._M_use_count + 8);
                      local_38[-1].curBB =
                           (size_t)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                      pmVar15 = std::__detail::
                                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&pFVar1->label2idx,(key_type *)&local_78);
                      idx = *pmVar15;
                    }
                    if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
                    }
                    if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      bVar19 = p_Var3->_M_use_count == 0xd;
                      p_Var17 = _Var18._M_pi;
                      if (bVar19) {
                        _Var18._M_pi = this_00._M_pi;
                        p_Var17 = p_Var3;
                      }
                      if (bVar19 && this_00._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                          UNLOCK();
                          p_Var17 = p_Var3;
                          _Var18._M_pi = this_00._M_pi;
                        }
                        else {
                          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                          p_Var17 = p_Var3;
                          _Var18._M_pi = this_00._M_pi;
                        }
                      }
                      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        lVar4._0_4_ = p_Var17[1]._M_use_count;
                        lVar4._4_4_ = p_Var17[1]._M_weak_count;
                        if (lVar4 != 0) {
                          iVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)
                                               &p_Var17[1]._M_use_count);
                          pAVar16 = (this->ars).c.
                                    super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                          if (pAVar16 ==
                              (this->ars).c.
                              super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                            pAVar16 = (this->ars).c.
                                      super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
                          }
                          pAVar16[-1].retVal = iVar8;
                        }
                        pFVar1 = local_38[-1].curFunc._M_data;
                        idx = (long)(pFVar1->insts).
                                    super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pFVar1->insts).
                                    super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4;
                      }
                      if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
                      }
                      if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        bVar19 = p_Var3->_M_use_count == 0xe;
                        local_50 = _Var18._M_pi;
                        if (bVar19) {
                          _Var18._M_pi = this_00._M_pi;
                          local_50 = p_Var3;
                        }
                        if (bVar19 && this_00._M_pi !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                            UNLOCK();
                            _Var18._M_pi = this_00._M_pi;
                            local_50 = p_Var3;
                          }
                          else {
                            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                            _Var18._M_pi = this_00._M_pi;
                            local_50 = p_Var3;
                          }
                        }
                        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          psVar5 = (shared_ptr<mocker::ir::Addr> *)
                                   local_50[5]._vptr__Sp_counted_base;
                          for (reg = *(shared_ptr<mocker::ir::Addr> **)&local_50[4]._M_use_count;
                              reg != psVar5; reg = reg + 1) {
                            local_48.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 = (element_type *)readVal(this,reg);
                            std::vector<long,_std::allocator<long>_>::emplace_back<long>
                                      (&local_78,(long *)&local_48);
                          }
                          iVar8 = executeFunc(this,(string *)&local_50[2]._M_use_count,&local_78);
                          peVar6 = *(element_type **)&local_50[1]._M_use_count;
                          if (peVar6 != (element_type *)0x0) {
                            local_48.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi =
                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_50[2]._vptr__Sp_counted_base;
                            if (local_48.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                (local_48.
                                 super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (local_48.
                                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                (local_48.
                                 super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (local_48.
                                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                              }
                            }
                            local_48.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 = peVar6;
                            writeReg<long>(this,&local_48,iVar8);
                            if (local_48.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_48.
                                         super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                            }
                          }
                          if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_78.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_78.
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                          }
                          idx = local_58 + 1;
                        }
                        if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (_Var18._M_pi);
                        }
                        if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                          bVar19 = p_Var3->_M_use_count == 0xf;
                          local_50 = _Var18._M_pi;
                          if (bVar19) {
                            _Var18._M_pi = this_00._M_pi;
                            local_50 = p_Var3;
                          }
                          if (bVar19 && this_00._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                              UNLOCK();
                              _Var18._M_pi = this_00._M_pi;
                              local_50 = p_Var3;
                            }
                            else {
                              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
                              _Var18._M_pi = this_00._M_pi;
                              local_50 = p_Var3;
                            }
                          }
                          if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0x0;
                            local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            do {
                              pFVar1 = local_38[-1].curFunc._M_data;
                              psVar2 = (pFVar1->insts).
                                       super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              if ((ulong)((long)(pFVar1->insts).
                                                super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)psVar2 >> 4) <= local_58) {
                                std::__throw_out_of_range_fmt
                                          (
                                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          );
                                goto LAB_0010a27f;
                              }
                              local_48.
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = *(element_type **)
                                        &psVar2[local_58].
                                         super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                              ;
                              if (*(int *)&local_48.
                                           super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr[1]._vptr_Addr == 0xf) {
                                local_48.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                      ((long)(psVar2 + local_58) + 8);
                                if (local_48.
                                    super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_48.
                                     super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_48.
                                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_48.
                                     super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_48.
                                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                              }
                              else {
                                local_48.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (element_type *)0x0;
                                local_48.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              }
                              peVar6 = local_48.
                                       super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              if (local_48.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr == (element_type *)0x0) {
                                executePhis(this,(vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                                  *)&local_78);
                                idx = local_58;
                              }
                              else {
                                std::
                                vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>
                                ::emplace_back<std::shared_ptr<mocker::ir::Phi>>
                                          ((vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>
                                            *)&local_78,(shared_ptr<mocker::ir::Phi> *)&local_48);
                                local_58 = local_58 + 1;
                              }
                              if (local_48.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_48.
                                           super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                            } while (peVar6 != (element_type *)0x0);
                            std::
                            vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                            ::~vector((vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                                       *)&local_78);
                          }
                          if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (_Var18._M_pi);
                          }
                          if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0010a27f:
                            __assert_fail("false",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                                          ,0x25e,
                                          "std::size_t mocker::ir::Interpreter::executeInst(std::size_t)"
                                         );
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return idx;
}

Assistant:

std::size_t Interpreter::executeInst(std::size_t idx) {
  auto &ar = ars.top();
  auto inst = ar.curFunc.get().insts.at(idx);
#ifdef PRINT_LOG
  std::cerr << fmtInst(inst) << std::endl;
#endif
  auto &func = ar.curFunc;
  if (auto p = dyc<Assign>(inst)) {
    auto operand = readVal(p->getOperand());
    writeReg(p->getDest(), operand);
    return idx + 1;
  }
  if (auto p = dyc<ArithUnaryInst>(inst)) {
    auto operand = readVal(p->getOperand());
    writeReg(p->getDest(),
             p->getOp() == ArithUnaryInst::OpType::Neg ? -operand : ~operand);
    return idx + 1;
  }
  if (auto p = dyc<ArithBinaryInst>(inst)) {
    auto lhs = readVal(p->getLhs()), rhs = readVal(p->getRhs());
    switch (p->getOp()) {
    case ArithBinaryInst::BitOr:
      writeReg(p->getDest(), lhs | rhs);
      break;
    case ArithBinaryInst::BitAnd:
      writeReg(p->getDest(), lhs & rhs);
      break;
    case ArithBinaryInst::Xor:
      writeReg(p->getDest(), lhs ^ rhs);
      break;
    case ArithBinaryInst::Shl:
      writeReg(p->getDest(), lhs << rhs);
      break;
    case ArithBinaryInst::Shr:
      writeReg(p->getDest(), lhs >> rhs);
      break;
    case ArithBinaryInst::Add:
      writeReg(p->getDest(), lhs + rhs);
      break;
    case ArithBinaryInst::Sub:
      writeReg(p->getDest(), lhs - rhs);
      break;
    case ArithBinaryInst::Mul:
      writeReg(p->getDest(), lhs * rhs);
      break;
    case ArithBinaryInst::Div:
      writeReg(p->getDest(), lhs / rhs);
      break;
    case ArithBinaryInst::Mod:
      writeReg(p->getDest(), lhs % rhs);
      break;
    default:
      assert(false);
    }
    return idx + 1;
  }
  if (auto p = dyc<RelationInst>(inst)) {
    auto lhs = readVal(p->getLhs()), rhs = readVal(p->getRhs());
    std::int64_t res;
    switch (p->getOp()) {
    case RelationInst::Eq:
      res = lhs == rhs;
      break;
    case RelationInst::Ne:
      res = lhs != rhs;
      break;
    case RelationInst::Lt:
      res = lhs < rhs;
      break;
    case RelationInst::Gt:
      res = lhs > rhs;
      break;
    case RelationInst::Le:
      res = lhs <= rhs;
      break;
    case RelationInst::Ge:
      res = lhs >= rhs;
      break;
    default:
      assert(false);
    }
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Load>(inst)) {
    auto addr = reinterpret_cast<std::int64_t *>(readVal(p->getAddr()));
    auto val = *addr;
    writeReg(p->getDest(), val);
    return idx + 1;
  }
  if (auto p = dyc<Store>(inst)) {
    std::int64_t val = readVal(p->getVal());
    auto addr = reinterpret_cast<std::int64_t *>(readVal(p->getAddr()));
    *addr = val;
    printLog((std::int64_t)addr, val);
    return idx + 1;
  }
  if (auto p = dyc<Alloca>(inst)) {
    auto res = fastMalloc(8);
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Malloc>(inst)) {
    auto sz = (std::size_t)readVal(p->getSize());
    auto res = fastMalloc(sz);
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Branch>(inst)) {
    auto condition = readVal(p->getCondition());
    auto nxtLabel = condition ? p->getThen() : p->getElse();
    ar.lastBB = ar.curBB;
    ar.curBB = nxtLabel->getID();
    return func.get().label2idx.at(nxtLabel->getID());
  }
  if (auto p = dyc<Jump>(inst)) {
    ar.lastBB = ar.curBB;
    ar.curBB = p->getLabel()->getID();
    return func.get().label2idx.at(p->getLabel()->getID());
  }
  if (auto p = dyc<Ret>(inst)) {
    if (p->getVal())
      ars.top().retVal = readVal(p->getVal());
    return func.get().insts.size();
  }
  if (auto p = dyc<Call>(inst)) {
    std::vector<std::int64_t> args;
    for (auto &argReg : p->getArgs())
      args.emplace_back(readVal(argReg));
    auto val = executeFunc(p->getFuncName(), args);
    if (p->getDest())
      writeReg(p->getDest(), val);
    return idx + 1;
  }
  if (auto p = dyc<Phi>(inst)) {
    std::vector<std::shared_ptr<Phi>> phis;
    while (true) {
      auto phi = dyc<Phi>(ar.curFunc.get().insts.at(idx));
      if (!phi) {
        executePhis(phis);
        return idx;
      }
      phis.emplace_back(std::move(phi));
      ++idx;
    }
  }
  assert(false);
}